

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqoptimizer.cpp
# Opt level: O1

void __thiscall SQOptimizer::optimize(SQOptimizer *this)

{
  SQFuncState *pSVar1;
  SQInstruction *pSVar2;
  uint uVar3;
  Jump *pJVar4;
  uint uVar5;
  JumpArg JVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  size_type sVar11;
  ulong uVar12;
  float fVar13;
  undefined1 local_58 [8];
  SQObjectValue SStack_50;
  undefined4 local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar6;
  
  this->codeChanged = true;
  uVar12 = 0;
  do {
    if (this->codeChanged == false) break;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    SStack_50.pTable = (SQTable *)0x0;
    local_48._0_1_ = false;
    local_48._1_1_ = JUMP_ARG1;
    local_48._2_2_ = 0;
    local_40 = uVar12;
    sqvector<SQOptimizer::Jump,_unsigned_int>::resize(&this->jumps,0,(Jump *)local_58);
    pSVar1 = this->fs;
    if ((pSVar1->_instructions)._size != 0) {
      uVar12 = 0;
      do {
        pSVar2 = (pSVar1->_instructions)._vals;
        uVar5 = pSVar2[uVar12].op - 0x22;
        uVar6 = (ulong)uVar5;
        if (uVar5 < 0x27) {
          iVar9 = (int)uVar12;
          if ((0x138180033U >> (uVar6 & 0x3f) & 1) == 0) {
            if ((0xcUL >> (uVar6 & 0x3f) & 1) == 0) {
              if (uVar6 != 0x26) goto LAB_0016e7a1;
              iVar10 = pSVar2[uVar12].field_0._arg1 + iVar9;
              goto LAB_0016e731;
            }
            iVar10 = iVar9 + (char)pSVar2[uVar12]._arg0 + 1;
            sVar11 = (this->jumps)._size;
            uVar5 = (this->jumps)._allocated;
            JVar7 = JUMP_ARG0;
          }
          else {
            iVar10 = iVar9 + pSVar2[uVar12].field_0._arg1 + 1;
LAB_0016e731:
            sVar11 = (this->jumps)._size;
            uVar5 = (this->jumps)._allocated;
            JVar7 = JUMP_ARG1;
          }
          if (uVar5 <= sVar11) {
            uVar3 = sVar11 * 2;
            if (sVar11 * 2 == 0) {
              uVar3 = 4;
            }
            pJVar4 = (Jump *)sq_vm_realloc((this->jumps)._alloc_ctx,(this->jumps)._vals,
                                           (ulong)uVar5 * 0x14,(ulong)uVar3 * 0x14);
            (this->jumps)._vals = pJVar4;
            (this->jumps)._allocated = uVar3;
          }
          pJVar4 = (this->jumps)._vals;
          uVar5 = (this->jumps)._size;
          (this->jumps)._size = uVar5 + 1;
          pJVar4[uVar5].originalInstructionIndex = iVar9;
          pJVar4[uVar5].instructionIndex = iVar9;
          pJVar4[uVar5].originalJumpTo = iVar10;
          pJVar4[uVar5].jumpTo = iVar10;
          pJVar4[uVar5].modified = false;
          pJVar4[uVar5].jumpArg = JVar7;
        }
LAB_0016e7a1:
        uVar12 = uVar12 + 1;
      } while (uVar12 < (pSVar1->_instructions)._size);
    }
    this->codeChanged = false;
    optimizeConstFolding(this);
    optimizeEmptyJumps(this);
    if ((this->codeChanged == true) && ((this->jumps)._size != 0)) {
      lVar8 = 0;
      uVar12 = 0;
      do {
        pJVar4 = (this->jumps)._vals;
        if ((&pJVar4->modified)[lVar8] == true) {
          uVar5 = *(uint *)((long)&pJVar4->instructionIndex + lVar8);
          iVar9 = (*(int *)((long)&pJVar4->originalInstructionIndex + lVar8) - uVar5) +
                  (*(int *)((long)&pJVar4->jumpTo + lVar8) -
                  *(int *)((long)&pJVar4->originalJumpTo + lVar8));
          pSVar2 = (pSVar1->_instructions)._vals;
          fVar13 = (float)pSVar2[uVar5].field_0._arg1;
          if ((&pJVar4->jumpArg)[lVar8] == JUMP_ARG1) {
            pSVar2[uVar5].field_0._arg1 = (int)fVar13 + iVar9;
          }
          else {
            iVar9 = (char)pSVar2[uVar5]._arg0 + iVar9;
            if ((char)(uchar)iVar9 == iVar9) {
              pSVar2[uVar5]._arg0 = (uchar)iVar9;
            }
            else if ((pSVar2[uVar5].op & 0xfe) == 0x24) {
              if (pSVar2[*(uint *)((long)&pJVar4->instructionIndex + lVar8)].op != '%') {
                fVar13 = (float)(int)fVar13;
              }
              local_58._0_5_ = 0x5000004;
              SStack_50.nInteger._4_4_ = 0;
              SStack_50.fFloat = fVar13;
              local_38 = SQFuncState::GetConstant(this->fs,(SQObject *)local_58,0xff);
              SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
              if ((local_38 & 0xffffff00) == 0) {
                pJVar4 = (this->jumps)._vals;
                (&pJVar4->jumpArg)[lVar8] = JUMP_ARG1;
                (pSVar1->_instructions)._vals[*(uint *)((long)&pJVar4->instructionIndex + lVar8)].
                field_0._arg1 = iVar9;
                uVar5 = *(uint *)((long)&((this->jumps)._vals)->instructionIndex + lVar8);
                pSVar2 = (pSVar1->_instructions)._vals;
                pSVar2[uVar5]._arg0 = (uchar)local_38;
                pSVar2[uVar5].op = '&';
              }
            }
          }
        }
        uVar12 = uVar12 + 1;
        lVar8 = lVar8 + 0x14;
      } while (uVar12 < (this->jumps)._size);
    }
    uVar12 = (ulong)((int)local_40 + 1);
  } while ((int)local_40 == 0);
  optimizeJumpFolding(this);
  return;
}

Assistant:

void SQOptimizer::optimize()
{
    codeChanged = true;
    for (int pass = 0; pass < 2 && codeChanged; pass++) {
        jumps.resize(0);
        SQInstructionVec & instr = fs->_instructions;
        for (int i = 0; i < instr.size(); i++)
            switch (instr[i].op) {
                case _OP_JMP:
                case _OP_JCMP:
                case _OP_JCMPK:
                case _OP_JZ:
                case _OP_AND:
                case _OP_OR:
                case _OP_PUSHTRAP:
                case _OP_FOREACH:
                case _OP_PREFOREACH:
                case _OP_POSTFOREACH:
                    jumps.push_back({i, i, i + instr[i]._arg1 + 1, i + instr[i]._arg1 + 1, false, JumpArg::JUMP_ARG1});
                    break;
                case _OP_JCMPI:
                case _OP_JCMPF:
                    jumps.push_back({i, i, i + instr[i]._sarg0() + 1, i + instr[i]._sarg0() + 1, false, JumpArg::JUMP_ARG0});
                    break;
                case _OP_NULLCOALESCE:
                    jumps.push_back({i, i, i + instr[i]._arg1, i + instr[i]._arg1, false, JumpArg::JUMP_ARG1});
                    break;
                default:
                    break;
            }

        codeChanged = false;
        optimizeConstFolding();
        optimizeEmptyJumps();

        if (codeChanged)
            for (int i = 0; i < jumps.size(); i++)
                if (jumps[i].modified) {
                    const int change = (jumps[i].jumpTo - jumps[i].originalJumpTo) - (jumps[i].instructionIndex - jumps[i].originalInstructionIndex);
                    if (jumps[i].jumpArg == JumpArg::JUMP_ARG1)
                        instr[jumps[i].instructionIndex]._arg1 += change;
                    else {
                        const SQInstruction originalJump = instr[jumps[i].instructionIndex];
                        const int nextJumpVal = originalJump._sarg0() + change;
                        if (nextJumpVal >= -128 && nextJumpVal <= 127)
                        {
                            instr[jumps[i].instructionIndex]._arg0 = nextJumpVal; // still fit
                        } else if (instr[jumps[i].instructionIndex].op == _OP_JCMPF || instr[jumps[i].instructionIndex].op == _OP_JCMPI) {
                            const uint32_t constI = fs->GetConstant(SQObjectPtr(instr[jumps[i].instructionIndex].op == _OP_JCMPF ? originalJump._farg1 : (SQInteger)originalJump._arg1), 255);
                            if (constI <= 255u) // we still fit in const table
                            {
                              jumps[i].jumpArg = JumpArg::JUMP_ARG1;
                              instr[jumps[i].instructionIndex]._arg1 = nextJumpVal;
                              instr[jumps[i].instructionIndex]._arg0 = constI;
                              instr[jumps[i].instructionIndex].op = _OP_JCMPK;
                            } else
                              assert(0);//todo: we need to convert back to OP_JCMP, and we need to generate load instruction for that
                        } else
                          assert(0);//todo: we need to convert back to OP_JCMP, and we need to generate load instruction for that
                    }
                }
    }

    optimizeJumpFolding();

#ifdef _DEBUG_DUMP
    for (int i = 0; i < jumps.size(); i++)
        printf(_SC("JUMPS:  instruction: %d  to: %d\n"), jumps[i].instructionIndex, jumps[i].jumpTo);
#endif

}